

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwSetWindowPos(GLFWwindow *handle,int xpos,int ypos)

{
  char *format;
  int error;
  _GLFWwindow *window;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (*(long *)(handle + 0x30) == 0) {
      _glfwPlatformSetWindowPos((_GLFWwindow *)handle,xpos,ypos);
      return;
    }
    format = "Full screen windows cannot be moved";
    error = 0x10004;
  }
  _glfwInputError(error,format);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowPos(GLFWwindow* handle, int xpos, int ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Full screen windows cannot be moved");
        return;
    }

    _glfwPlatformSetWindowPos(window, xpos, ypos);
}